

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeDValue cellMargin(Rtree *pRtree,RtreeCell *p)

{
  double local_38;
  double local_28;
  int ii;
  RtreeDValue margin;
  RtreeCell *p_local;
  Rtree *pRtree_local;
  
  margin = 0.0;
  ii = pRtree->nDim2 - 2;
  do {
    if (pRtree->eCoordType == '\0') {
      local_28 = (double)p->aCoord[ii + 1].f;
    }
    else {
      local_28 = (double)p->aCoord[ii + 1].i;
    }
    if (pRtree->eCoordType == '\0') {
      local_38 = (double)p->aCoord[ii].f;
    }
    else {
      local_38 = (double)p->aCoord[ii].i;
    }
    margin = (local_28 - local_38) + margin;
    ii = ii + -2;
  } while (-1 < ii);
  return margin;
}

Assistant:

static RtreeDValue cellMargin(Rtree *pRtree, RtreeCell *p){
  RtreeDValue margin = 0;
  int ii = pRtree->nDim2 - 2;
  do{
    margin += (DCOORD(p->aCoord[ii+1]) - DCOORD(p->aCoord[ii]));
    ii -= 2;
  }while( ii>=0 );
  return margin;
}